

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

WirehairResult __thiscall
wirehair::Codec::ReconstructOutput(Codec *this,void *message_out,uint64_t message_bytes)

{
  ushort peel_column_count;
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  WirehairResult WVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint16_t row_i;
  ushort uVar9;
  short sVar10;
  uint uVar11;
  uint i;
  long lVar12;
  uint uVar13;
  uint uVar14;
  PeelRow *pPVar15;
  uint16_t peel_x;
  uint8_t *puVar16;
  bool bVar17;
  PeelRowParameters params;
  ushort auStack_4e [3];
  ulong local_48;
  ulong local_40;
  uint8_t *local_38;
  
  WVar4 = Wirehair_InvalidInput;
  if ((message_out != (void *)0x0) &&
     ((this->_block_count - 1) * this->_block_bytes + this->_output_final_bytes == message_bytes)) {
    local_38 = this->_copied_original;
    uVar9 = 0;
    memset(local_38,0,(ulong)this->_block_count);
    puVar16 = this->_input_blocks;
    pPVar15 = this->_peel_rows;
    while( true ) {
      peel_column_count = this->_block_count;
      uVar14 = (uint)peel_column_count;
      if (this->_row_count <= uVar9) break;
      uVar6 = pPVar15->RecoveryId;
      uVar7 = this->_block_bytes;
      if (uVar6 < uVar14) {
        uVar11 = uVar7;
        if (uVar6 == uVar14 - 1) {
          uVar11 = this->_output_final_bytes;
        }
        memcpy((void *)((ulong)(uVar7 * uVar6) + (long)message_out),puVar16,(ulong)uVar11);
        local_38[uVar6] = '\x01';
        uVar7 = this->_block_bytes;
      }
      uVar9 = uVar9 + 1;
      pPVar15 = pPVar15 + 1;
      puVar16 = puVar16 + uVar7;
    }
    uVar6 = this->_block_bytes;
    uVar8 = 0;
    uVar7 = uVar6;
    while (uVar8 != peel_column_count) {
      local_40 = uVar8 + 1;
      if (local_38[uVar8] == '\0') {
        uVar6 = this->_output_final_bytes;
        PeelRowParameters::Initialize
                  (&params,(uint32_t)uVar8,this->_p_seed,peel_column_count,this->_mix_count);
        uVar3 = params.PeelAdd;
        local_48 = (ulong)params.MixFirst;
        uVar9 = this->_block_next_prime;
        uVar11 = (uint)params.PeelAdd;
        uVar1 = this->_mix_count;
        uVar2 = this->_mix_next_prime;
        uVar8 = local_48;
        for (lVar12 = 1; lVar12 != 3; lVar12 = lVar12 + 1) {
          uVar8 = (ulong)(((uint)uVar8 & 0xffff) + (uint)params.MixAdd) % (ulong)uVar2;
          if ((uint)uVar1 <= (uint)uVar8) {
            uVar5 = (uint)uVar2 - (uint)uVar8;
            uVar13 = uVar5 & 0xffff;
            if (params.MixAdd < (ushort)uVar5) {
              uVar8 = (ulong)((uint)params.MixAdd * 0x10000 - uVar13) % (ulong)(uint)params.MixAdd;
            }
            else {
              uVar8 = (ulong)(params.MixAdd - uVar13);
            }
          }
          auStack_4e[lVar12] = (ushort)uVar8;
        }
        uVar5 = this->_block_bytes;
        puVar16 = this->_recovery_blocks;
        if (local_40 == peel_column_count) {
          uVar7 = uVar6;
        }
        if (params.PeelCount == 1) {
          gf256_addset_mem(message_out,puVar16 + uVar5 * params.PeelFirst,
                           puVar16 + uVar5 * (params.MixFirst + uVar14),uVar7);
        }
        else {
          uVar8 = (ulong)((uint)params.PeelFirst + (uint)params.PeelAdd) % (ulong)uVar9;
          if (uVar14 <= (uint)uVar8) {
            uVar6 = (uint)uVar9 - (uint)uVar8;
            uVar13 = uVar6 & 0xffff;
            if (params.PeelAdd < (ushort)uVar6) {
              uVar8 = (ulong)(uVar11 * 0x10000 - uVar13) % (ulong)uVar11;
            }
            else {
              uVar8 = (ulong)(params.PeelAdd - uVar13);
            }
          }
          sVar10 = params.PeelCount - 2;
          gf256_addset_mem(message_out,puVar16 + uVar5 * params.PeelFirst,
                           puVar16 + uVar5 * ((uint)uVar8 & 0xffff),uVar7);
          while (bVar17 = sVar10 != 0, sVar10 = sVar10 + -1, bVar17) {
            uVar8 = (ulong)(((uint)uVar8 & 0xffff) + uVar11) % (ulong)uVar9;
            if (uVar14 <= (uint)uVar8) {
              uVar6 = (uint)uVar9 - (uint)uVar8;
              uVar5 = uVar6 & 0xffff;
              if (uVar3 < (ushort)uVar6) {
                uVar8 = (ulong)(uVar11 * 0x10000 - uVar5) % (ulong)uVar11;
              }
              else {
                uVar8 = (ulong)(uVar11 - uVar5);
              }
            }
            gf256_add_mem(message_out,
                          this->_recovery_blocks + ((uint)uVar8 & 0xffff) * this->_block_bytes,uVar7
                         );
          }
          gf256_add_mem(message_out,
                        this->_recovery_blocks + ((int)local_48 + uVar14) * this->_block_bytes,uVar7
                       );
        }
        gf256_add2_mem(message_out,
                       this->_recovery_blocks + (auStack_4e[1] + uVar14) * this->_block_bytes,
                       this->_recovery_blocks + (auStack_4e[2] + uVar14) * this->_block_bytes,uVar7)
        ;
        uVar6 = this->_block_bytes;
      }
      message_out = (void *)((long)message_out + (ulong)uVar6);
      uVar8 = local_40;
    }
    WVar4 = Wirehair_Success;
  }
  return WVar4;
}

Assistant:

WirehairResult Codec::ReconstructOutput(
    void * GF256_RESTRICT message_out,
    uint64_t message_bytes)
{
    CAT_IF_DUMP(cout << endl << "---- ReconstructOutput ----" << endl << endl;)

    // Validate input
    if (!message_out) {
        return Wirehair_InvalidInput;
    }
    if (message_bytes != _block_bytes * (_block_count - 1) + _output_final_bytes) {
        CAT_DEBUG_BREAK();
        return Wirehair_InvalidInput;
    }
    uint8_t * GF256_RESTRICT output_blocks = reinterpret_cast<uint8_t *>( message_out );

#if defined(CAT_COPY_FIRST_N)
    // Re-purpose and initialize an array to store whether or not each row id needs to be regenerated
    uint8_t * GF256_RESTRICT copied_original = _copied_original;
    memset(copied_original, 0, _block_count);

    // Copy any original message rows that were received
    const uint8_t * GF256_RESTRICT src = _input_blocks;
    PeelRow * GF256_RESTRICT row = _peel_rows;

    // For each row:
    for (uint16_t row_i = 0; row_i < _row_count; ++row_i, ++row, src += _block_bytes)
    {
        const uint32_t block_id = row->RecoveryId;

        // If the row identifier indicates it is part of the original message data:
        if (block_id < _block_count)
        {
            CAT_IF_DUMP(cout << "Copying received row " << id << endl;)

            uint8_t * GF256_RESTRICT dest = output_blocks + _block_bytes * block_id;
            const unsigned bytes = (block_id != (unsigned)_block_count - 1) ? _block_bytes : _output_final_bytes;

            memcpy(dest, src, bytes);

            copied_original[block_id] = 1;
        }
    }
#endif // CAT_COPY_FIRST_N

    // Regenerate any rows that got lost:

    uint8_t * GF256_RESTRICT dest = output_blocks;
    unsigned block_bytes = _block_bytes;

    // For each block to generate:
    const uint16_t block_count = _block_count;
    for (uint32_t block_id = 0; block_id < block_count; ++block_id, dest += _block_bytes)
    {
#if defined(CAT_COPY_FIRST_N)
        // If already copied, skip it
        if (copied_original[block_id]) {
            continue;
        }
#endif // CAT_COPY_FIRST_N
        // For last row, use final byte count
        if (block_id + 1 == block_count) {
            block_bytes = _output_final_bytes;
        }

        CAT_IF_DUMP(cout << "Regenerating row " << row_i << ":";)

        PeelRowParameters params;
        params.Initialize(block_id, _p_seed, block_count, _mix_count);

        PeelRowIterator iter(params, block_count, _block_next_prime);
        const RowMixIterator mix(params, _mix_count, _mix_next_prime);

        const uint16_t peel_0 = iter.GetColumn();

        // Remember first column (there is always at least one)
        CAT_DEBUG_ASSERT(peel_0 < _recovery_rows);
        const uint8_t * GF256_RESTRICT first = _recovery_blocks + _block_bytes * peel_0;

        CAT_IF_DUMP(cout << " " << peel_0;)

        // If peeler has multiple columns:
        if (iter.Iterate())
        {
            const uint16_t peel_1 = iter.GetColumn();

            CAT_IF_DUMP(cout << " " << peel_1;)

            // Combine first two columns into output buffer (faster than memcpy + memxor)
            CAT_DEBUG_ASSERT(peel_1 < _recovery_rows);
            gf256_addset_mem(dest, first, _recovery_blocks + _block_bytes * peel_1, block_bytes);

            // For each remaining peeler column:
            while (iter.Iterate())
            {
                const uint16_t peel_x = iter.GetColumn();

                CAT_IF_DUMP(cout << " " << peel_x;)

                // Mix in each column
                CAT_DEBUG_ASSERT(peel_x < _recovery_rows);
                gf256_add_mem(dest, _recovery_blocks + _block_bytes * peel_x, block_bytes);
            }

            // Mix first mixer block in directly
            CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[0]) < _recovery_rows);
            gf256_add_mem(dest, _recovery_blocks + _block_bytes * (block_count + mix.Columns[0]), block_bytes);
        }
        else
        {
            // Mix first with first mixer block (faster than memcpy + memxor)
            CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[0]) < _recovery_rows);
            gf256_addset_mem(dest, first, _recovery_blocks + _block_bytes * (block_count + mix.Columns[0]), block_bytes);
        }

        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[0]);)

        // Combine remaining two mixer columns together:
        CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[1]) < _recovery_rows);
        const uint8_t *mix0_src = _recovery_blocks + _block_bytes * (block_count + mix.Columns[1]);
        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[1]);)

        CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[2]) < _recovery_rows);
        const uint8_t *mix1_src = _recovery_blocks + _block_bytes * (block_count + mix.Columns[2]);
        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[2]);)

        gf256_add2_mem(dest, mix0_src, mix1_src, block_bytes);

        CAT_IF_DUMP(cout << endl;)
    } // next row

    return Wirehair_Success;
}